

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint64_t *puVar7;
  secp256k1_fe *psVar8;
  bool bVar9;
  secp256k1_gej b2;
  secp256k1_gej a2;
  secp256k1_fe sStack_108;
  secp256k1_fe local_e0;
  secp256k1_fe local_b8;
  uint64_t local_88 [5];
  secp256k1_fe local_60;
  secp256k1_fe local_38;
  
  iVar4 = 0;
  if ((a->infinity != b->infinity) || (iVar4 = 1, a->infinity != 0)) {
    return iVar4;
  }
  puVar7 = local_88;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar7 = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    puVar7 = puVar7 + 1;
  }
  psVar8 = &sStack_108;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    psVar8->n[0] = (b->x).n[0];
    b = (secp256k1_gej *)((b->x).n + 1);
    psVar8 = (secp256k1_fe *)((long)psVar8 + 8);
  }
  secp256k1_fe_impl_normalize((secp256k1_fe *)local_88);
  secp256k1_fe_impl_normalize(&local_60);
  secp256k1_fe_impl_normalize(&local_38);
  secp256k1_fe_impl_normalize(&sStack_108);
  secp256k1_fe_impl_normalize(&local_e0);
  secp256k1_fe_impl_normalize(&local_b8);
  uVar3 = 4;
  do {
    uVar1 = sStack_108.n[uVar3];
    uVar2 = local_88[uVar3];
    if (uVar2 >= uVar1 && uVar2 != uVar1) {
      iVar4 = 1;
      goto LAB_0016979c;
    }
    if (uVar2 < uVar1) {
      iVar4 = -1;
      goto LAB_0016979c;
    }
    bVar9 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar9);
  iVar4 = 0;
LAB_0016979c:
  uVar3 = 4;
  do {
    uVar1 = local_e0.n[uVar3];
    uVar2 = local_60.n[uVar3];
    if (uVar2 >= uVar1 && uVar2 != uVar1) {
      iVar5 = 1;
      goto LAB_001697c9;
    }
    if (uVar2 < uVar1) {
      iVar5 = -1;
      goto LAB_001697c9;
    }
    bVar9 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar9);
  iVar5 = 0;
LAB_001697c9:
  uVar3 = 4;
  do {
    if (local_38.n[uVar3] != local_b8.n[uVar3]) {
      bVar9 = true;
      goto LAB_001697ef;
    }
    bVar9 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar9);
  bVar9 = false;
LAB_001697ef:
  return (uint)((iVar5 == 0 && iVar4 == 0) && !bVar9);
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}